

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawTiltedSpanPalCommand::DrawTiltedSpanPalCommand
          (DrawTiltedSpanPalCommand *this,int y,int x1,int x2,FVector3 *plane_sz,FVector3 *plane_su,
          FVector3 *plane_sv,bool plane_shade,int planeshade,float planelightfloat,fixed_t pviewx,
          fixed_t pviewy)

{
  float planelightfloat_local;
  bool plane_shade_local;
  FVector3 *plane_su_local;
  FVector3 *plane_sz_local;
  int x2_local;
  int x1_local;
  int y_local;
  DrawTiltedSpanPalCommand *this_local;
  
  DrawerCommand::DrawerCommand(&this->super_DrawerCommand);
  (this->super_DrawerCommand)._vptr_DrawerCommand =
       (_func_int **)&PTR__DrawTiltedSpanPalCommand_009eac10;
  *(int *)&(this->super_DrawerCommand).field_0xc = y;
  this->x1 = x1;
  this->x2 = x2;
  TVector3<float>::TVector3(&this->plane_sz,plane_sz);
  TVector3<float>::TVector3(&this->plane_su,plane_su);
  TVector3<float>::TVector3(&this->plane_sv,plane_sv);
  this->plane_shade = plane_shade;
  this->planeshade = planeshade;
  this->planelightfloat = planelightfloat;
  this->pviewx = pviewx;
  this->pviewy = pviewy;
  this->_colormap = drawerargs::ds_colormap;
  this->_destorg = drawerargs::dc_destorg;
  this->_ybits = _ds_ybits;
  this->_xbits = _ds_xbits;
  this->_source = drawerargs::ds_source;
  this->basecolormapdata = (uint8_t *)*basecolormap;
  return;
}

Assistant:

DrawTiltedSpanPalCommand::DrawTiltedSpanPalCommand(int y, int x1, int x2, const FVector3 &plane_sz, const FVector3 &plane_su, const FVector3 &plane_sv, bool plane_shade, int planeshade, float planelightfloat, fixed_t pviewx, fixed_t pviewy)
		: y(y), x1(x1), x2(x2), plane_sz(plane_sz), plane_su(plane_su), plane_sv(plane_sv), plane_shade(plane_shade), planeshade(planeshade), planelightfloat(planelightfloat), pviewx(pviewx), pviewy(pviewy)
	{
		using namespace drawerargs;

		_colormap = ds_colormap;
		_destorg = dc_destorg;
		_ybits = ds_ybits;
		_xbits = ds_xbits;
		_source = ds_source;
		basecolormapdata = basecolormap->Maps;
	}